

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::internal::LazyDescriptor::OnceInternal(LazyDescriptor *this)

{
  bool bVar1;
  anon_union_8_8_13f84498_for_Symbol_2 *in_RDI;
  Symbol SVar2;
  Symbol result;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  LogMessage *this_00;
  undefined8 in_stack_ffffffffffffff88;
  Symbol local_68 [2];
  byte local_41;
  undefined1 in_stack_ffffffffffffffe7;
  undefined8 in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  
  local_41 = 0;
  if (((byte)in_RDI[3].descriptor[0x41] & 1) == 0) {
    this_00 = (LogMessage *)&stack0xffffffffffffffc0;
    LogMessage::LogMessage
              ((LogMessage *)in_RDI,(LogLevel_conflict)((ulong)in_stack_ffffffffffffff88 >> 0x20),
               (char *)this_00,in_stack_ffffffffffffff7c);
    local_41 = 1;
    LogMessage::operator<<
              (this_00,(char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  if ((local_41 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x4b4ed1);
  }
  if ((in_RDI->descriptor == (Descriptor *)0x0) && (in_RDI[1].descriptor != (Descriptor *)0x0)) {
    SVar2 = DescriptorPool::CrossLinkOnDemandHelper
                      ((DescriptorPool *)in_stack_fffffffffffffff0,
                       (string *)in_stack_ffffffffffffffe8,(bool)in_stack_ffffffffffffffe7);
    local_68[0].field_1 = SVar2.field_1;
    local_68[0].type = SVar2.type;
    bVar1 = Symbol::IsNull(local_68);
    if ((!bVar1) && (local_68[0].type == MESSAGE)) {
      *in_RDI = local_68[0].field_1;
    }
  }
  return;
}

Assistant:

void LazyDescriptor::OnceInternal() {
  GOOGLE_CHECK(file_->finished_building_);
  if (!descriptor_ && name_) {
    Symbol result = file_->pool_->CrossLinkOnDemandHelper(*name_, false);
    if (!result.IsNull() && result.type == Symbol::MESSAGE) {
      descriptor_ = result.descriptor;
    }
  }
}